

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::Program::Program
          (Program *this,Functions *gl,char *vertexSource,char *fragmentSource)

{
  ProgramSources *this_00;
  allocator<char> local_17a;
  allocator<char> local_179;
  string local_178;
  string local_158;
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  ProgramSources local_e8;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,vertexSource,&local_179);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,fragmentSource,&local_17a)
  ;
  memset(&local_e8,0,0xac);
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_e8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_e8._193_8_ = 0;
  glu::VertexSource::VertexSource((VertexSource *)local_110,&local_158);
  this_00 = glu::ProgramSources::operator<<(&local_e8,(ShaderSource *)local_110);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_138,&local_178);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_138);
  std::__cxx11::string::~string((string *)(local_138 + 8));
  std::__cxx11::string::~string((string *)(local_110 + 8));
  glu::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,gl,&local_e8);
  glu::ProgramSources::~ProgramSources(&local_e8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  return;
}

Assistant:

Program (const glw::Functions& gl, const char* vertexSource, const char* fragmentSource)
		: glu::ShaderProgram(gl, programSources(vertexSource, fragmentSource)) {}